

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

void mxx::all2allv<char>(char *msgs,
                        vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
                        vector<unsigned_long,_std::allocator<unsigned_long>_> *send_displs,char *out
                        ,vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
                        vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_displs,
                        comm *comm)

{
  ulong uVar1;
  pointer puVar2;
  vector<int,_std::allocator<int>_> recv_dis;
  vector<int,_std::allocator<int>_> send_dis;
  vector<int,_std::allocator<int>_> recv_counts;
  datatype dt_1;
  vector<int,_std::allocator<int>_> send_counts;
  size_t max;
  datatype mpi_sizet;
  size_t local_max_size;
  
  uVar1 = 0;
  for (puVar2 = (send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 != (send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    uVar1 = uVar1 + *puVar2;
  }
  local_max_size = 0;
  for (puVar2 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 != (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    local_max_size = local_max_size + *puVar2;
  }
  if (local_max_size < uVar1) {
    local_max_size = uVar1;
  }
  mpi_sizet._vptr_datatype = (_func_int **)&PTR__datatype_0017fc80;
  mpi_sizet.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  mpi_sizet.builtin = true;
  MPI_Allreduce(&local_max_size,&max,1,&ompi_mpi_unsigned_long,&ompi_mpi_op_max,comm->mpi_comm);
  if (max < 0x7fffffff) {
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)&send_counts,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&recv_counts);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)&recv_counts,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&send_dis);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)&send_dis,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(send_displs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(send_displs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&recv_dis);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)&recv_dis,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(recv_displs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(recv_displs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&dt_1);
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_0017fc80;
    dt_1.mpitype = (MPI_Datatype)&ompi_mpi_char;
    dt_1.builtin = true;
    MPI_Alltoallv(msgs,send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                  send_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,&ompi_mpi_char,out,
                  recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  recv_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,&ompi_mpi_char,comm->mpi_comm);
    datatype::~datatype(&dt_1);
    if (recv_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(recv_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)recv_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)recv_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (send_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(send_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)send_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)send_dis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    impl::all2allv_big<char>(msgs,send_sizes,send_displs,out,recv_sizes,recv_displs,comm);
  }
  datatype::~datatype(&mpi_sizet);
  return;
}

Assistant:

void all2allv(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& send_displs, T* out, const std::vector<size_t>& recv_sizes, const std::vector<size_t>& recv_displs, const mxx::comm& comm = mxx::comm()) {
    size_t total_send_size = std::accumulate(send_sizes.begin(), send_sizes.end(), static_cast<size_t>(0));
    size_t total_recv_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), static_cast<size_t>(0));
    size_t local_max_size = std::max(total_send_size, total_recv_size);
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    size_t max;
    MPI_Allreduce(&local_max_size, &max, 1, mpi_sizet.type(), MPI_MAX, comm);
    if (max >= mxx::max_int) {
        impl::all2allv_big(msgs, send_sizes, send_displs, out, recv_sizes, recv_displs, comm);
    } else {
        // convert vectors to integer counts
        std::vector<int> send_counts(send_sizes.begin(), send_sizes.end());
        std::vector<int> recv_counts(recv_sizes.begin(), recv_sizes.end());
        // get displacements
        std::vector<int> send_dis(send_displs.begin(), send_displs.end());
        std::vector<int> recv_dis(recv_displs.begin(), recv_displs.end());
        // call regular alltoallv
        mxx::datatype dt = mxx::get_datatype<T>();
#if MXX_BENCHMARK_ALL2ALL
        comm.barrier();
        auto start = std::chrono::steady_clock::now();
#endif
        MPI_Alltoallv(const_cast<T*>(msgs), &send_counts[0], &send_dis[0], dt.type(),
                      out, &recv_counts[0], &recv_dis[0], dt.type(), comm);
#if MXX_BENCHMARK_ALL2ALL
        auto end = std::chrono::steady_clock::now();
        // time in microseconds
        double time_all2all = std::chrono::duration_cast<std::chrono::microseconds>(end - start).count();
        double max_time = mxx::allreduce(time_all2all, mxx::max<double>(), comm);
        double min_time = mxx::allreduce(time_all2all, mxx::min<double>(), comm);

        size_t bytes_sendrecv = (total_send_size+total_recv_size)*sizeof(T);
        size_t max_sendrecv = mxx::allreduce(bytes_sendrecv, mxx::max<size_t>(), comm);

        // output benchmark only if there is the all2all is big enough
        if (max_sendrecv >= 1024*1024 || max_time >= 100000.0) {
            size_t global_send = mxx::allreduce(total_send_size, comm);
            size_t global_recv = mxx::allreduce(total_recv_size, comm);
            size_t max_send = mxx::allreduce(total_send_size, mxx::max<size_t>(), comm);
            size_t max_recv = mxx::allreduce(total_recv_size, mxx::max<size_t>(), comm);

            // bandwidth in Gb/s
            double max_bw = 8*max_sendrecv / max_time / 1000.0;
            // TODO: potentially aggregate BW per node instead of per process
            // TODO: ignore self-send data (and/or also same node)
            if (comm.rank() == 0) {
                std::cerr << std::fixed << std::setprecision(2) << std::setw(4);
                std::cerr << "[MPI_Alltoallv] Max BW: " << max_bw << " Gb/s,  time: [" << min_time/1000.0 << "ms," << max_time/1000.0 << "ms], max mem: [send=" << max_send*sizeof(T)/1024/1024 << "MiB,recv=" << max_recv*sizeof(T)/1024/1024 << "MiB], max inbalance: [send=" << max_send*comm.size()*1.0/global_send << ",recv=" << max_recv*comm.size()*1.0/global_recv << "]" << std::endl;
            }
        }
#endif
    }
}